

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O1

void h262_print_gop(h262_gop *gop)

{
  puts("GOP header:");
  printf("\tdrop_frame_flag = %d\n",(ulong)gop->drop_frame_flag);
  printf("\ttime_code_hours = %d\n",(ulong)gop->time_code_hours);
  printf("\ttime_code_minutes = %d\n",(ulong)gop->time_code_minutes);
  printf("\ttime_code_seconds = %d\n",(ulong)gop->time_code_seconds);
  printf("\ttime_code_pictures = %d\n",(ulong)gop->time_code_pictures);
  printf("\tclosed_gop = %d\n",(ulong)gop->closed_gop);
  printf("\tbroken_link = %d\n",(ulong)gop->broken_link);
  return;
}

Assistant:

void h262_print_gop(struct h262_gop *gop) {
	printf("GOP header:\n");
	printf("\tdrop_frame_flag = %d\n", gop->drop_frame_flag);
	printf("\ttime_code_hours = %d\n", gop->time_code_hours);
	printf("\ttime_code_minutes = %d\n", gop->time_code_minutes);
	printf("\ttime_code_seconds = %d\n", gop->time_code_seconds);
	printf("\ttime_code_pictures = %d\n", gop->time_code_pictures);
	printf("\tclosed_gop = %d\n", gop->closed_gop);
	printf("\tbroken_link = %d\n", gop->broken_link);
}